

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O1

value __thiscall cpp_db::sqlite_result::get_column_value(sqlite_result *this,int column)

{
  element_type *peVar1;
  undefined4 uVar2;
  int iVar3;
  sqlite3_stmt *psVar4;
  long lVar5;
  uchar *__first;
  _Storage *p_Var6;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _Storage extraout_RDX_01;
  _Storage _Var7;
  undefined4 in_register_00000034;
  undefined1 auVar8 [16];
  value vVar9;
  allocator_type local_49;
  _Storage local_48;
  _Storage _Stack_40;
  _Storage local_38;
  _Storage _Stack_30;
  
  psVar4 = get_stmt_handle((sqlite_result *)CONCAT44(in_register_00000034,column));
  uVar2 = sqlite3_column_type(psVar4,in_EDX);
  switch(uVar2) {
  case 1:
    auVar8 = sqlite3_column_int64(psVar4,in_EDX);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<long>::_S_manage;
    break;
  case 2:
    peVar1 = (element_type *)sqlite3_column_double(psVar4,in_EDX);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<double>::_S_manage;
    (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar1;
    _Var7 = extraout_RDX_01;
    goto LAB_0010ab47;
  case 3:
    lVar5 = sqlite3_column_text(psVar4,in_EDX);
    iVar3 = sqlite3_column_bytes(psVar4,in_EDX);
    local_48._M_ptr = &local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,lVar5,iVar3 + lVar5);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)
         std::any::
         _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_S_manage;
    (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    p_Var6 = (_Storage *)operator_new(0x20);
    auVar8._8_8_ = local_48._M_ptr;
    auVar8._0_8_ = p_Var6;
    p_Var6->_M_ptr = p_Var6 + 2;
    if ((_Storage *)local_48._M_ptr == &local_38) {
      p_Var6[2] = local_38;
      p_Var6[3] = _Stack_30;
    }
    else {
      p_Var6->_M_ptr = (void *)local_48;
      p_Var6[2] = local_38;
    }
    p_Var6[1] = _Stack_40;
    break;
  case 4:
    __first = (uchar *)sqlite3_column_blob(psVar4,in_EDX);
    iVar3 = sqlite3_column_bytes(psVar4,in_EDX);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,__first,
               __first + iVar3,&local_49);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)
         std::any::_Manager_external<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
         _S_manage;
    (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    p_Var6 = (_Storage *)operator_new(0x18);
    auVar8._8_8_ = extraout_RDX_00;
    auVar8._0_8_ = p_Var6;
    *p_Var6 = local_48;
    p_Var6[1] = _Stack_40;
    p_Var6[2] = local_38;
    break;
  default:
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<cpp_db::null_type>::_S_manage;
    auVar8._8_8_ = extraout_RDX;
    auVar8._0_8_ = &void::typeinfo;
  }
  _Var7 = auVar8._8_8_;
  (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       auVar8._0_8_;
LAB_0010ab47:
  vVar9._M_storage._M_ptr = _Var7._M_ptr;
  vVar9._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return vVar9;
}

Assistant:

value sqlite_result::get_column_value(int column) const
{
	sqlite3_stmt *pstmt = get_stmt_handle();

    switch (sqlite3_column_type(pstmt, column))
    {
    case SQLITE_INTEGER:	// int64
        return static_cast<int64_t>(sqlite3_column_int64(pstmt, column));
    case SQLITE_FLOAT:		// double
        return sqlite3_column_double(pstmt, column);
    case SQLITE_BLOB:		// void *
    {
        const uint8_t *data = static_cast<const uint8_t*>(sqlite3_column_blob(pstmt, column));
        return blob(data, data + sqlite3_column_bytes(pstmt, column));
    }
    case SQLITE_TEXT:		// const char *
        return std::string(reinterpret_cast<const char *>(sqlite3_column_text(pstmt, column))
                           , static_cast<size_t>(sqlite3_column_bytes(pstmt, column)));
    case SQLITE_NULL:		//
    default:
        break;
    }
    return null_type();
}